

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O2

Expression __thiscall
cnn::SimpleRNNBuilder::add_auxiliary_input(SimpleRNNBuilder *this,Expression *in,Expression *aux)

{
  ComputationGraph *pCVar1;
  undefined8 *puVar2;
  long lVar3;
  ulong uVar4;
  ComputationGraph *pCVar5;
  uint uVar6;
  undefined8 *in_RCX;
  long lVar7;
  long lVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __x;
  Expression EVar9;
  Expression y;
  initializer_list<cnn::expr::Expression> local_d8;
  VariableIndex *local_c8;
  long local_c0;
  initializer_list<cnn::expr::Expression> local_b8;
  undefined1 local_a8 [16];
  pointer local_98;
  undefined4 local_90;
  ComputationGraph *local_88;
  uint local_80;
  ExecutionEngine *local_78;
  undefined4 local_70;
  undefined8 local_68;
  undefined4 local_60;
  SimpleRNNBuilder *local_58;
  long local_50;
  ulong local_48;
  undefined8 *local_40;
  ulong local_38;
  
  lVar7 = *(long *)&in[5].i;
  pCVar5 = in[6].pg;
  local_58 = this;
  local_40 = in_RCX;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_a8,
             (ulong)in[8].i.t,(allocator_type *)&y);
  local_c8 = &in[5].i;
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            ((vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)&in[5].i,
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_a8);
  uVar4 = ((long)pCVar5 - lVar7) / 0x18;
  std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~_Vector_base
            ((_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_a8
            );
  local_48 = uVar4 & 0xffffffff;
  lVar7 = 8;
  local_c0 = local_48 * 0x18;
  local_50 = (ulong)((int)uVar4 - 1) * 0x18;
  lVar8 = 0;
  local_38 = 0;
  pCVar5 = aux->pg;
  uVar6 = (aux->i).t;
  do {
    if (in[8].i.t <= local_38) {
      lVar7 = *(long *)(*(long *)local_c8 + 8 + local_c0);
      (local_58->super_RNNBuilder)._vptr_RNNBuilder = *(_func_int ***)(lVar7 + -0x10);
      (local_58->super_RNNBuilder).cur.t = *(int *)(lVar7 + -8);
      EVar9._8_8_ = lVar7;
      EVar9.pg = (ComputationGraph *)local_58;
      return EVar9;
    }
    pCVar1 = in[4].pg;
    puVar2 = *(undefined8 **)
              ((long)&(pCVar1->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar8);
    if ((ulong)(*(long *)((long)&(pCVar1->nodes).
                                 super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + lVar8) - (long)puVar2)
        < 0x31) {
      __assert_fail("vars.size() >= L2H + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/rnn.cc"
                    ,0x62,
                    "Expression cnn::SimpleRNNBuilder::add_auxiliary_input(const Expression &, const Expression &)"
                   );
    }
    local_a8._0_8_ = puVar2[4];
    local_d8._M_array = (iterator)local_a8;
    local_a8._8_4_ = *(undefined4 *)(puVar2 + 5);
    local_98 = (pointer)*puVar2;
    local_90 = *(undefined4 *)(puVar2 + 1);
    local_78 = (ExecutionEngine *)puVar2[6];
    local_70 = *(undefined4 *)(puVar2 + 7);
    local_68 = *local_40;
    local_60 = *(undefined4 *)(local_40 + 1);
    local_d8._M_len = 5;
    local_88 = pCVar5;
    local_80 = uVar6;
    expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
              ((detail *)&y,&local_d8);
    if (local_48 == 0) {
      pCVar5 = in[7].pg;
      __x = extraout_XMM0_Qa;
      if (*(ComputationGraph **)&in[7].i != pCVar5) {
        local_a8._0_8_ = y.pg;
        local_a8._8_4_ = y.i.t;
        lVar3 = *(long *)((long)&(pCVar1->nodes).
                                 super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar8);
        local_98 = *(pointer *)(lVar3 + 0x10);
        local_90 = *(undefined4 *)(lVar3 + 0x18);
        local_88 = *(ComputationGraph **)((long)pCVar5 + lVar7 + -8);
        local_80 = *(uint *)((long)&(pCVar5->nodes).
                                    super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar7);
        local_b8._M_len = 3;
        local_b8._M_array = (iterator)local_a8;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_d8,&local_b8);
        __x = extraout_XMM0_Qa_01;
        goto LAB_00238639;
      }
    }
    else {
      local_a8._0_8_ = y.pg;
      local_a8._8_4_ = y.i.t;
      lVar3 = *(long *)((long)&(pCVar1->nodes).
                               super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl
                               .super__Vector_impl_data._M_start + lVar8);
      local_b8._M_array = (iterator)local_a8;
      local_98 = *(pointer *)(lVar3 + 0x10);
      local_90 = *(undefined4 *)(lVar3 + 0x18);
      local_88 = *(ComputationGraph **)(*(long *)(*(long *)local_c8 + local_50) + -8 + lVar7);
      local_80 = *(uint *)(*(long *)(*(long *)local_c8 + local_50) + lVar7);
      local_b8._M_len = 3;
      expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&local_d8,&local_b8);
      __x = extraout_XMM0_Qa_00;
LAB_00238639:
      y.pg = (ComputationGraph *)local_d8._M_array;
      y.i.t = (uint)local_d8._M_len;
    }
    expr::tanh((expr *)local_a8,__x);
    lVar8 = lVar8 + 0x18;
    local_38 = local_38 + 1;
    lVar3 = *(long *)(*(long *)local_c8 + local_c0);
    *(undefined8 *)(lVar3 + -8 + lVar7) = local_a8._0_8_;
    *(undefined4 *)(lVar3 + lVar7) = local_a8._8_4_;
    lVar7 = lVar7 + 0x10;
    pCVar5 = (ComputationGraph *)local_a8._0_8_;
    uVar6 = local_a8._8_4_;
  } while( true );
}

Assistant:

Expression SimpleRNNBuilder::add_auxiliary_input(const Expression &in, const Expression &aux) {
  const unsigned t = h.size();
  h.push_back(vector<Expression>(layers));

  Expression x = in;

  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    assert(vars.size() >= L2H + 1);

    Expression y = affine_transform({vars[HB], vars[X2H], x, vars[L2H], aux});

    if (t == 0 && h0.size() > 0)
      y = affine_transform({y, vars[H2H], h0[i]});
    else if (t >= 1)
      y = affine_transform({y, vars[H2H], h[t-1][i]});

    x = h[t][i] = tanh(y);
  }
  return h[t].back();
}